

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_equal(lua_State *L,int idx1,int idx2)

{
  TValue *pTVar1;
  TValue *pTVar2;
  bool local_49;
  TValue *base;
  cTValue *o2;
  cTValue *o1;
  int idx2_local;
  int idx1_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx1);
  pTVar2 = index2adr(L,idx2);
  if (((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffff3) &&
     ((uint)((int)(pTVar2->field_4).it >> 0xf) < 0xfffffff3)) {
    L_local._4_4_ = (uint)(pTVar1->n == pTVar2->n);
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == (int)(pTVar2->field_4).it >> 0xf) {
    if ((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffffd) {
      if (pTVar1->u64 == pTVar2->u64) {
        L_local._4_4_ = 1;
      }
      else if ((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffff5) {
        pTVar1 = lj_meta_equal(L,(GCobj *)(pTVar1->u64 & 0x7fffffffffff),
                               (GCobj *)(pTVar2->u64 & 0x7fffffffffff),0);
        if (pTVar1 < (TValue *)0x2) {
          L_local._4_4_ = (uint)pTVar1;
        }
        else {
          L->top = pTVar1 + 2;
          lj_vm_call(L,pTVar1,2);
          L->top = L->top + -3;
          L_local._4_4_ = (uint)((uint)((int)L->top[2].field_4.it >> 0xf) < 0xfffffffe);
        }
      }
      else {
        L_local._4_4_ = 0;
      }
    }
    else {
      local_49 = false;
      if (pTVar1 != (TValue *)((L->glref).ptr64 + 0xf8)) {
        local_49 = pTVar2 != (TValue *)((L->glref).ptr64 + 0xf8);
      }
      L_local._4_4_ = (uint)local_49;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_equal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) == intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) == numberVnum(o2);
  } else if (itype(o1) != itype(o2)) {
    return 0;
  } else if (tvispri(o1)) {
    return o1 != niltv(L) && o2 != niltv(L);
#if LJ_64 && !LJ_GC64
  } else if (tvislightud(o1)) {
    return o1->u64 == o2->u64;
#endif
  } else if (gcrefeq(o1->gcr, o2->gcr)) {
    return 1;
  } else if (!tvistabud(o1)) {
    return 0;
  } else {
    TValue *base = lj_meta_equal(L, gcV(o1), gcV(o2), 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}